

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O2

void __thiscall higan::InetAddress::InetAddress(InetAddress *this,int port)

{
  string local_48 [39];
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"0.0.0.0",&local_21);
  std::__cxx11::string::string((string *)this,local_48);
  this->port_ = port;
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

InetAddress::InetAddress(int port):
		InetAddress("0.0.0.0", port)
{

}